

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O0

void __thiscall OpenMD::Perturbations::Light::initialize(Light *this)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  reference pvVar5;
  mapped_type *pmVar6;
  SquareMatrix3<double> *this_00;
  pointer ppVar7;
  reference pvVar8;
  long lVar9;
  undefined8 uVar10;
  SnapshotManager *this_01;
  double *pdVar11;
  SquareMatrix3<double> *this_02;
  long in_RDI;
  RealType RVar12;
  double dVar13;
  SquareMatrix3<double> *__y;
  RealType phi;
  RealType theta;
  RealType psi;
  int storageLayout_;
  iterator polStrIter;
  int currentLineLength;
  string allowedPolarizations;
  LightPolarization lp;
  string lpl;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
  stringToPolarization;
  RealType intense;
  vector<double,_std::allocator<double>_> pd;
  vector<double,_std::allocator<double>_> k;
  bool havePolarization;
  bool haveFrequency;
  bool haveDirection;
  bool haveE0;
  LightParameters *in_stack_fffffffffffffbe8;
  Vector<double,_3U> *in_stack_fffffffffffffbf0;
  Vector<double,_3U> *in_stack_fffffffffffffbf8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  allocator<char> *in_stack_fffffffffffffc20;
  errorStruct *in_stack_fffffffffffffc28;
  errorStruct *in_stack_fffffffffffffc30;
  double local_270;
  double local_268;
  double local_260;
  undefined8 local_258;
  uint local_24c;
  string local_248 [32];
  _Self local_228;
  _Self local_220;
  int local_214;
  string local_210 [32];
  complex<double> local_1f0;
  complex<double> local_1e0;
  complex<double> local_1d0;
  complex<double> local_1c0;
  complex<double> local_1b0;
  complex<double> local_1a0;
  complex<double> local_190;
  complex<double> local_180;
  _Base_ptr local_170;
  LightPolarization local_164;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [80];
  double local_70;
  vector<double,_std::allocator<double>_> local_50;
  vector<double,_std::allocator<double>_> local_28;
  byte local_c;
  byte local_b;
  byte local_a;
  byte local_9;
  
  local_9 = 0;
  local_a = 0;
  local_b = 0;
  local_c = 0;
  bVar2 = LightParameters::haveWaveVector((LightParameters *)0x366a28);
  if (bVar2) {
    LightParameters::getWaveVector(in_stack_fffffffffffffbe8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,0);
    vVar1 = *pvVar5;
    pdVar11 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x40));
    *pdVar11 = vVar1;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,1);
    vVar1 = *pvVar5;
    pdVar11 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x40));
    *pdVar11 = vVar1;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,2);
    vVar1 = *pvVar5;
    pdVar11 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x40));
    *pdVar11 = vVar1;
    dVar13 = Vector<double,_3U>::length((Vector<double,_3U> *)0x366b4f);
    *(double *)(in_RDI + 0x68) = dVar13;
    *(double *)(in_RDI + 0x60) = 6.283185307179586 / *(double *)(in_RDI + 0x68);
    *(double *)(in_RDI + 0x58) = 18836.515673088536 / *(double *)(in_RDI + 0x60);
    local_b = 1;
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffbf0,
               (Vector3<double> *)in_stack_fffffffffffffbe8);
    Vector<double,_3U>::normalize(in_stack_fffffffffffffbf0);
    local_a = 1;
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffc00);
  }
  bVar2 = LightParameters::havePropagationDirection((LightParameters *)0x366c17);
  if (bVar2) {
    if ((local_a & 1) != 0) {
      snprintf(painCave.errMsg,2000,
               "light: please specify either waveVector or propagationDirection, but not both.\n");
      painCave.isFatal = 1;
      simError();
    }
    LightParameters::getPropagationDirection(in_stack_fffffffffffffbe8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,0);
    vVar1 = *pvVar5;
    pdVar11 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x28));
    *pdVar11 = vVar1;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,1);
    vVar1 = *pvVar5;
    pdVar11 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x28));
    *pdVar11 = vVar1;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,2);
    vVar1 = *pvVar5;
    pdVar11 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x28));
    *pdVar11 = vVar1;
    Vector<double,_3U>::normalize(in_stack_fffffffffffffbf0);
    local_a = 1;
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffc00);
  }
  bVar2 = LightParameters::haveWavelength((LightParameters *)0x366dc8);
  if (bVar2) {
    if ((local_b & 1) != 0) {
      snprintf(painCave.errMsg,2000,
               "light: please specify one of: waveVector, wavelength, orfrequency (but only one of these).\n"
              );
      painCave.isFatal = 1;
      simError();
    }
    RVar12 = LightParameters::getWavelength((LightParameters *)0x366e1c);
    *(double *)(in_RDI + 0x60) = RVar12 * 10.0;
    *(double *)(in_RDI + 0x58) = 18836.515673088536 / *(double *)(in_RDI + 0x60);
    *(double *)(in_RDI + 0x68) = 6.283185307179586 / *(double *)(in_RDI + 0x60);
    local_b = 1;
  }
  bVar2 = LightParameters::haveFrequency((LightParameters *)0x366e72);
  if (bVar2) {
    if ((local_b & 1) != 0) {
      snprintf(painCave.errMsg,2000,
               "light: please specify one of: waveVector, wavelength, orfrequency (but only one of these).\n"
              );
      painCave.isFatal = 1;
      simError();
    }
    RVar12 = LightParameters::getFrequency((LightParameters *)0x366ec6);
    *(double *)(in_RDI + 0x58) = RVar12 * 1e-15;
    *(double *)(in_RDI + 0x60) = 18836.515673088536 / *(double *)(in_RDI + 0x58);
    *(double *)(in_RDI + 0x68) = 6.283185307179586 / *(double *)(in_RDI + 0x60);
    local_b = 1;
  }
  if (((local_b & 1) != 0) && ((local_a & 1) != 0)) {
    OpenMD::operator*(in_stack_fffffffffffffbf8,(double)in_stack_fffffffffffffbf0);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  }
  bVar2 = LightParameters::haveIntensity((LightParameters *)0x366f6a);
  if (bVar2) {
    RVar12 = LightParameters::getIntensity((LightParameters *)0x366f81);
    local_70 = RVar12 * 1.439326e-11;
    dVar13 = sqrt((local_70 * 2.0) / 0.7184379357665581);
    *(double *)(in_RDI + 0x70) = dVar13;
    local_9 = 1;
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::clear
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x366ff4);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             in_stack_fffffffffffffc20,CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)
            );
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
         *)0x367013);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc30,in_stack_fffffffffffffc28->errMsg,in_stack_fffffffffffffc20);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                         *)in_stack_fffffffffffffc30,(key_type *)in_stack_fffffffffffffc28);
  *pmVar6 = lightX;
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc30,in_stack_fffffffffffffc28->errMsg,in_stack_fffffffffffffc20);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                         *)in_stack_fffffffffffffc30,(key_type *)in_stack_fffffffffffffc28);
  *pmVar6 = lightY;
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc30,in_stack_fffffffffffffc28->errMsg,in_stack_fffffffffffffc20);
  this_00 = (SquareMatrix3<double> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                          *)in_stack_fffffffffffffc30,(key_type *)in_stack_fffffffffffffc28);
  *(undefined4 *)(this_00->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
       = 2;
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc30,in_stack_fffffffffffffc28->errMsg,in_stack_fffffffffffffc20);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                         *)in_stack_fffffffffffffc30,(key_type *)in_stack_fffffffffffffc28);
  *pmVar6 = lightMinus;
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  bVar2 = LightParameters::havePolarization((LightParameters *)0x36720c);
  if (bVar2) {
    LightParameters::getPolarization_abi_cxx11_(in_stack_fffffffffffffbe8);
    local_170 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                        *)in_stack_fffffffffffffbe8,(key_type *)0x367255);
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>
                           *)0x36727c);
    local_164 = ppVar7->second;
    switch(local_164) {
    case lightX:
      std::complex<double>::complex(&local_180,1.0,0.0);
      pvVar8 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          (in_RDI + 0x78),0);
      *(undefined8 *)pvVar8->_M_value = local_180._M_value._0_8_;
      *(undefined8 *)(pvVar8->_M_value + 8) = local_180._M_value._8_8_;
      std::complex<double>::complex(&local_190,0.0,0.0);
      pvVar8 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          (in_RDI + 0x78),1);
      *(undefined8 *)pvVar8->_M_value = local_190._M_value._0_8_;
      *(undefined8 *)(pvVar8->_M_value + 8) = local_190._M_value._8_8_;
      local_c = 1;
      break;
    case lightY:
      std::complex<double>::complex(&local_1a0,0.0,0.0);
      pvVar8 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          (in_RDI + 0x78),0);
      *(undefined8 *)pvVar8->_M_value = local_1a0._M_value._0_8_;
      *(undefined8 *)(pvVar8->_M_value + 8) = local_1a0._M_value._8_8_;
      std::complex<double>::complex(&local_1b0,1.0,0.0);
      pvVar8 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          (in_RDI + 0x78),1);
      *(undefined8 *)pvVar8->_M_value = local_1b0._M_value._0_8_;
      *(undefined8 *)(pvVar8->_M_value + 8) = local_1b0._M_value._8_8_;
      local_c = 1;
      break;
    case lightPlus:
      std::complex<double>::complex(&local_1c0,1.0,0.0);
      pvVar8 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          (in_RDI + 0x78),0);
      *(undefined8 *)pvVar8->_M_value = local_1c0._M_value._0_8_;
      *(undefined8 *)(pvVar8->_M_value + 8) = local_1c0._M_value._8_8_;
      std::complex<double>::complex(&local_1d0,0.0,1.0);
      pvVar8 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          (in_RDI + 0x78),1);
      *(undefined8 *)pvVar8->_M_value = local_1d0._M_value._0_8_;
      *(undefined8 *)(pvVar8->_M_value + 8) = local_1d0._M_value._8_8_;
      local_c = 1;
      break;
    case lightMinus:
      std::complex<double>::complex(&local_1e0,1.0,0.0);
      pvVar8 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          (in_RDI + 0x78),0);
      *(undefined8 *)pvVar8->_M_value = local_1e0._M_value._0_8_;
      *(undefined8 *)(pvVar8->_M_value + 8) = local_1e0._M_value._8_8_;
      std::complex<double>::complex(&local_1f0,0.0,-1.0);
      pvVar8 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          (in_RDI + 0x78),1);
      *(undefined8 *)pvVar8->_M_value = local_1f0._M_value._0_8_;
      *(undefined8 *)(pvVar8->_M_value + 8) = local_1f0._M_value._8_8_;
      local_c = 1;
      break;
    default:
      snprintf(painCave.errMsg,2000,"Light: Unknown polarization type\n");
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    std::__cxx11::string::~string(local_160);
  }
  else {
    std::__cxx11::string::string(local_210);
    local_214 = 0;
    local_220._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                  *)in_stack_fffffffffffffbe8);
    while( true ) {
      local_228._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                  *)in_stack_fffffffffffffbe8);
      bVar2 = std::operator!=(&local_220,&local_228);
      if (!bVar2) break;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>
                    *)0x3676ff);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                     in_stack_fffffffffffffc10);
      std::__cxx11::string::operator+=(local_210,local_248);
      std::__cxx11::string::~string(local_248);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>
                    *)0x367749);
      iVar3 = std::__cxx11::string::length();
      local_214 = local_214 + iVar3 + 2;
      if (0x31 < local_214) {
        std::__cxx11::string::operator+=(local_210,"\n\t\t");
        local_214 = 0;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>
                    *)in_stack_fffffffffffffbf0);
    }
    lVar9 = std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)local_210,lVar9 - 2);
    uVar10 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "Light: No polarization was set in the omd file. This parameter\n\tmust be set to use Light, and can take any of these values:\n\t\t%s.\n"
             ,uVar10);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    std::__cxx11::string::~string(local_210);
  }
  if (((((local_9 & 1) == 0) || ((local_a & 1) == 0)) || ((local_b & 1) == 0)) ||
     ((local_c & 1) == 0)) {
    if ((local_a & 1) == 0) {
      snprintf(painCave.errMsg,2000,"Light: could not determine direction of propagation.\n");
      painCave.isFatal = 1;
      simError();
    }
    if ((local_9 & 1) == 0) {
      snprintf(painCave.errMsg,2000,"Light: intensity not specified.\n");
      painCave.isFatal = 1;
      simError();
    }
    if ((local_b & 1) == 0) {
      in_stack_fffffffffffffc30 = &painCave;
      snprintf(painCave.errMsg,2000,"Light: could not determine frequency or wavelength.\n");
      *(undefined4 *)((long)in_stack_fffffffffffffc30->errMsg + 2000) = 1;
      simError();
    }
    if ((local_c & 1) == 0) {
      in_stack_fffffffffffffc28 = &painCave;
      snprintf(painCave.errMsg,2000,"Light: polarization  not specifieid.\n");
      *(undefined4 *)((long)in_stack_fffffffffffffc28->errMsg + 2000) = 1;
      simError();
    }
  }
  else {
    *(undefined1 *)(in_RDI + 0x11) = 1;
  }
  this_01 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x18));
  uVar4 = SnapshotManager::getAtomStorageLayout(this_01);
  if ((uVar4 & 0x40) != 0) {
    *(undefined1 *)(in_RDI + 0x12) = 1;
  }
  local_258 = 0;
  local_268 = 1.0;
  local_270 = -1.0;
  local_24c = uVar4;
  pdVar11 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x28),2);
  pdVar11 = std::max<double>(&local_270,pdVar11);
  pdVar11 = std::min<double>(&local_268,pdVar11);
  local_260 = acos(*pdVar11);
  pdVar11 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x28),1);
  __y = (SquareMatrix3<double> *)((ulong)*pdVar11 ^ 0x8000000000000000);
  this_02 = (SquareMatrix3<double> *)
            Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x28),0);
  atan2((double)__y,
        (this_02->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0]);
  SquareMatrix3<double>::setupRotMat
            ((SquareMatrix3<double> *)in_stack_fffffffffffffc30,(double)in_stack_fffffffffffffc28,
             (double)this_01,(double)CONCAT44(uVar4,in_stack_fffffffffffffc18));
  SquareMatrix3<double>::inverse(this_00);
  SquareMatrix3<double>::operator=(this_02,__y);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x367bb5);
  *(undefined1 *)(in_RDI + 0x10) = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
          *)0x367bce);
  return;
}

Assistant:

void Light::initialize() {
    bool haveE0           = false;
    bool haveDirection    = false;
    bool haveFrequency    = false;
    bool havePolarization = false;

    if (lightParams->haveWaveVector()) {
      std::vector<RealType> k = lightParams->getWaveVector();
      // wave vectors are input in inverse angstroms, so no unit conversion:
      k_.x()        = k[0];
      k_.y()        = k[1];
      k_.z()        = k[2];
      kmag_         = k_.length();
      lambda_       = 2.0 * Constants::PI / kmag_;
      omega_        = 2.0 * Constants::PI * Constants::c / lambda_;
      haveFrequency = true;
      khat_         = k_;
      khat_.normalize();
      haveDirection = true;
    }

    if (lightParams->havePropagationDirection()) {
      if (haveDirection) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "light: please specify either waveVector or "
                 "propagationDirection, but not both.\n");
        painCave.isFatal = 1;
        simError();
      }
      std::vector<RealType> pd = lightParams->getPropagationDirection();
      khat_.x()                = pd[0];
      khat_.y()                = pd[1];
      khat_.z()                = pd[2];
      khat_.normalize();
      haveDirection = true;
    }

    if (lightParams->haveWavelength()) {
      if (haveFrequency) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "light: please specify one of: waveVector, wavelength, or"
                 "frequency (but only one of these).\n");
        painCave.isFatal = 1;
        simError();
      }
      // wavelengths are entered in nm to work with experimentalists.
      // Convert to angstroms:
      lambda_       = lightParams->getWavelength() * 10.0;
      omega_        = 2.0 * Constants::PI * Constants::c / lambda_;
      kmag_         = 2.0 * Constants::PI / lambda_;
      haveFrequency = true;
    }

    if (lightParams->haveFrequency()) {
      if (haveFrequency) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "light: please specify one of: waveVector, wavelength, or"
                 "frequency (but only one of these).\n");
        painCave.isFatal = 1;
        simError();
      }
      // frequencies are entered in Hz to work with experimentalists.
      // Convert to fs^-1
      omega_        = lightParams->getFrequency() * 1.0e-15;
      lambda_       = 2.0 * Constants::PI * Constants::c / omega_;
      kmag_         = 2.0 * Constants::PI / lambda_;
      haveFrequency = true;
    }

    if (haveFrequency && haveDirection) { k_ = khat_ * kmag_; }

    if (lightParams->haveIntensity()) {
      RealType intense = lightParams->getIntensity();
      // intensities are input in W/cm^2
      intense *= 1.439326e-11;
      E0_ = std::sqrt(2.0 * intense / (Constants::epsilon0 * Constants::c));
      // E0 now has units of kcal/mol e^-1 Angstroms^-1
      haveE0 = true;
    }

    // Determine Polarization Type
    jones_.clear();
    jones_.reserve(2);
    std::map<std::string, LightPolarization> stringToPolarization;

    stringToPolarization["X"] = lightX;
    stringToPolarization["Y"] = lightY;
    stringToPolarization["+"] = lightPlus;
    stringToPolarization["-"] = lightMinus;

    if (lightParams->havePolarization()) {
      std::string lpl      = lightParams->getPolarization();
      LightPolarization lp = stringToPolarization.find(lpl)->second;
      switch (lp) {
      case lightX:
        jones_[0]        = {1.0, 0.0};
        jones_[1]        = {0.0, 0.0};
        havePolarization = true;
        break;
      case lightY:
        jones_[0]        = {0.0, 0.0};
        jones_[1]        = {1.0, 0.0};
        havePolarization = true;
        break;
      case lightPlus:
        jones_[0]        = {1.0, 0.0};
        jones_[1]        = {0.0, 1.0};
        havePolarization = true;
        break;
      case lightMinus:
        jones_[0]        = {1.0, 0.0};
        jones_[1]        = {0.0, -1.0};
        havePolarization = true;
        break;
      default:
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: Unknown polarization type\n");
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
        break;
      }

    } else {
      std::string allowedPolarizations;
      int currentLineLength = 0;

      for (std::map<std::string, LightPolarization>::iterator polStrIter =
               stringToPolarization.begin();
           polStrIter != stringToPolarization.end(); ++polStrIter) {
        allowedPolarizations += polStrIter->first + ", ";
        currentLineLength += polStrIter->first.length() + 2;

        if (currentLineLength >= 50) {
          allowedPolarizations += "\n\t\t";
          currentLineLength = 0;
        }
      }

      allowedPolarizations.erase(allowedPolarizations.length() - 2, 2);

      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Light: No polarization was set in the omd file. This parameter\n"
          "\tmust be set to use Light, and can take any of these values:\n"
          "\t\t%s.\n",
          allowedPolarizations.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (haveE0 && haveDirection && haveFrequency && havePolarization) {
      doLight = true;
    } else {
      if (!haveDirection) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: could not determine direction of propagation.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveE0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: intensity not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveFrequency) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: could not determine frequency or wavelength.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!havePolarization) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: polarization  not specifieid.\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    int storageLayout_ = info_->getSnapshotManager()->getAtomStorageLayout();
    if (storageLayout_ & DataStorage::dslParticlePot) doParticlePot = true;

    // Relatively simple Euler angles between khat_ and lab frame:

    RealType psi = 0.0;
    RealType theta =
        acos(std::min((RealType)1.0, std::max((RealType)-1.0, khat_[2])));
    RealType phi = std::atan2(-khat_[1], khat_[0]);

    if (phi < 0) phi += 2.0 * Constants::PI;

    A_.setupRotMat(phi, theta, psi);
    Ainv_ = A_.inverse();

    initialized = true;
  }